

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___tostring(lua_State *L)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  GCcdata *pGVar5;
  long *plVar6;
  cTValue *tv_00;
  GCstr *pGVar7;
  lua_State *in_RDI;
  cTValue *tv;
  CType *ct;
  CTState *cts;
  void *p;
  CTypeID id;
  char *msg;
  GCcdata *cd;
  CTState *cts_1;
  CType *ct_1;
  undefined8 in_stack_fffffffffffffda8;
  lua_State *in_stack_fffffffffffffdb0;
  lua_State *in_stack_fffffffffffffdb8;
  void *in_stack_fffffffffffffdc0;
  TValue *pTVar8;
  CTState *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  uint64_t in_stack_fffffffffffffdd8;
  GCcdata local_210;
  char *local_200;
  lua_State *local_1d0;
  lua_State *local_168;
  lua_State *local_128;
  GCstr *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  CTypeID id_00;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  GCcdata local_8;
  
  id_00 = (CTypeID)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  pGVar5 = ffi_checkcdata(in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
  ;
  local_200 = "cdata<%s>: %p";
  uVar1 = pGVar5->ctypeid;
  local_210 = (GCcdata)(pGVar5 + 1);
  if (uVar1 == 0x15) {
    local_200 = "ctype<%s>";
  }
  else {
    plVar6 = (long *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x194);
    plVar6[2] = (long)in_RDI;
    local_1d0 = (lua_State *)(*plVar6 + (ulong)(uint)uVar1 * 0x10);
    while ((local_1d0->nextgc).gcptr32 >> 0x1c == 8) {
      local_1d0 = (lua_State *)(*plVar6 + (ulong)((local_1d0->nextgc).gcptr32 & 0xffff) * 0x10);
    }
    if (((local_1d0->nextgc).gcptr32 & 0xf0800000) == 0x20800000) {
      local_210 = *(GCcdata *)local_210;
      local_128 = local_1d0;
      do {
        local_1d0 = (lua_State *)(*plVar6 + (ulong)((local_128->nextgc).gcptr32 & 0xffff) * 0x10);
        local_128 = local_1d0;
      } while ((local_1d0->nextgc).gcptr32 >> 0x1c == 8);
    }
    if (((local_1d0->nextgc).gcptr32 & 0xf4000000) == 0x34000000) {
      pTVar8 = in_RDI->top + -1;
      pGVar7 = lj_ctype_repr_complex
                         (in_RDI,in_stack_fffffffffffffdc0,
                          (CTSize)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      (pTVar8->u32).lo = (uint32_t)pGVar7;
      (pTVar8->field_2).it = 0xfffffffb;
      goto LAB_0014162d;
    }
    iVar2._0_1_ = local_1d0->marked;
    iVar2._1_1_ = local_1d0->gct;
    iVar2._2_1_ = local_1d0->dummy_ffid;
    iVar2._3_1_ = local_1d0->status;
    if ((iVar2 == 8) && (((local_1d0->nextgc).gcptr32 & 0xfc000000) == 0)) {
      pTVar8 = in_RDI->top + -1;
      in_stack_fffffffffffffdb8 = in_RDI;
      pGVar7 = lj_ctype_repr_int64(local_1d0,in_stack_fffffffffffffdd8,iVar4);
      (pTVar8->u32).lo = (uint32_t)pGVar7;
      (pTVar8->field_2).it = 0xfffffffb;
      goto LAB_0014162d;
    }
    if ((local_1d0->nextgc).gcptr32 >> 0x1c == 6) {
      local_210 = *(GCcdata *)local_210;
    }
    else if ((local_1d0->nextgc).gcptr32 >> 0x1c == 5) {
      local_200 = "cdata<%s>: %d";
      uVar3 = *(uint *)local_210;
      local_210.marked = '\0';
      local_210.gct = '\0';
      local_210.ctypeid = 0;
      local_210.nextgc.gcptr32 = uVar3;
    }
    else {
      if ((local_1d0->nextgc).gcptr32 >> 0x1c == 2) {
        in_stack_ffffffffffffffec._0_1_ = local_1d0->marked;
        in_stack_ffffffffffffffec._1_1_ = local_1d0->gct;
        in_stack_ffffffffffffffec._2_1_ = local_1d0->dummy_ffid;
        in_stack_ffffffffffffffec._3_1_ = local_1d0->status;
        if (in_stack_ffffffffffffffec == 4) {
          local_8.marked = '\0';
          local_8.gct = '\0';
          local_8.ctypeid = 0;
          local_8.nextgc.gcptr32 = *(uint *)local_210;
        }
        else {
          local_8 = *(GCcdata *)local_210;
        }
        local_210 = local_8;
        local_168 = local_1d0;
        do {
          local_1d0 = (lua_State *)(*plVar6 + (ulong)((local_168->nextgc).gcptr32 & 0xffff) * 0x10);
          local_168 = local_1d0;
        } while ((local_1d0->nextgc).gcptr32 >> 0x1c == 8);
      }
      if ((((local_1d0->nextgc).gcptr32 >> 0x1c == 1) ||
          (((local_1d0->nextgc).gcptr32 & 0xf8000000) == 0x38000000)) &&
         (tv_00 = lj_ctype_meta(in_stack_fffffffffffffdc8,
                                (CTypeID)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                                (MMS)in_stack_fffffffffffffdc0), tv_00 != (cTValue *)0x0)) {
        iVar4 = lj_meta_tailcall(in_RDI,tv_00);
        return iVar4;
      }
    }
  }
  pGVar7 = lj_ctype_repr((lua_State *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                         id_00,in_stack_ffffffffffffffd8);
  lj_strfmt_pushf(in_RDI,local_200,pGVar7 + 1,local_210);
LAB_0014162d:
  if (*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x54) <=
      *(uint *)((ulong)(in_RDI->glref).ptr32 + 0x50)) {
    lj_gc_step(in_stack_fffffffffffffdb8);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___tostring)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  const char *msg = "cdata<%s>: %p";
  CTypeID id = cd->ctypeid;
  void *p = cdataptr(cd);
  if (id == CTID_CTYPEID) {
    msg = "ctype<%s>";
    id = *(CTypeID *)p;
  } else {
    CTState *cts = ctype_cts(L);
    CType *ct = ctype_raw(cts, id);
    if (ctype_isref(ct->info)) {
      p = *(void **)p;
      ct = ctype_rawchild(cts, ct);
    }
    if (ctype_iscomplex(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_complex(L, cdataptr(cd), ct->size));
      goto checkgc;
    } else if (ct->size == 8 && ctype_isinteger(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_int64(L, *(uint64_t *)cdataptr(cd),
					       (ct->info & CTF_UNSIGNED)));
      goto checkgc;
    } else if (ctype_isfunc(ct->info)) {
      p = *(void **)p;
    } else if (ctype_isenum(ct->info)) {
      msg = "cdata<%s>: %d";
      p = (void *)(uintptr_t)*(uint32_t *)p;
    } else {
      if (ctype_isptr(ct->info)) {
	p = cdata_getptr(p, ct->size);
	ct = ctype_rawchild(cts, ct);
      }
      if (ctype_isstruct(ct->info) || ctype_isvector(ct->info)) {
	/* Handle ctype __tostring metamethod. */
	cTValue *tv = lj_ctype_meta(cts, ctype_typeid(cts, ct), MM_tostring);
	if (tv)
	  return lj_meta_tailcall(L, tv);
      }
    }
  }
  lj_strfmt_pushf(L, msg, strdata(lj_ctype_repr(L, id, NULL)), p);
checkgc:
  lj_gc_check(L);
  return 1;
}